

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_vector.c
# Opt level: O2

vector vector_copy(vector v)

{
  size_t sVar1;
  size_t sVar2;
  vector __ptr;
  void *__dest;
  
  if (v != (vector)0x0) {
    __ptr = (vector)malloc(0x20);
    if (__ptr == (vector)0x0) {
      log_write_impl_va("metacall",0x7a,"vector_copy",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_vector.c"
                        ,LOG_LEVEL_ERROR,"Vector allocation error");
      return (vector)0x0;
    }
    sVar1 = v->type_size;
    sVar2 = v->capacity;
    __dest = malloc(sVar2 * sVar1);
    __ptr->data = __dest;
    if (__dest != (void *)0x0) {
      __ptr->capacity = sVar2;
      sVar2 = v->size;
      __ptr->size = sVar2;
      __ptr->type_size = sVar1;
      memcpy(__dest,v->data,sVar2 * sVar1);
      return __ptr;
    }
    log_write_impl_va("metacall",0x83,"vector_copy",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_vector.c"
                      ,LOG_LEVEL_ERROR,"Vector internal allocation error");
    free(__ptr);
  }
  return (vector)0x0;
}

Assistant:

vector vector_copy(vector v)
{
	if (v != NULL)
	{
		vector dest = malloc(sizeof(struct vector_type));

		if (dest == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Vector allocation error");

			return NULL;
		}

		dest->data = malloc(v->type_size * v->capacity);

		if (dest->data == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Vector internal allocation error");

			free(dest);

			return NULL;
		}

		dest->capacity = v->capacity;
		dest->size = v->size;
		dest->type_size = v->type_size;

		memcpy(dest->data, v->data, dest->size * dest->type_size);

		return dest;
	}

	return NULL;
}